

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O2

void __thiscall
TPZSkylMatrix<std::complex<float>_>::Write
          (TPZSkylMatrix<std::complex<float>_> *this,TPZStream *buf,int withclassid)

{
  complex<float> **ppcVar1;
  complex<float> *pcVar2;
  long lVar3;
  complex<float> *pcVar4;
  TPZVec<long> skyl;
  TPZVec<long> TStack_38;
  long local_18;
  
  TPZBaseMatrix::Write((TPZBaseMatrix *)this,buf,withclassid);
  TPZStream::Write<std::complex<float>>(buf,&this->fStorage);
  local_18 = 0;
  TPZVec<long>::TPZVec
            (&TStack_38,(this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow + 1,
             &local_18);
  pcVar4 = (complex<float> *)(this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow;
  pcVar2 = pcVar4;
  if (pcVar4 != (complex<float> *)0x0) {
    pcVar2 = (this->fStorage).fStore;
  }
  ppcVar1 = (this->fElem).fStore;
  for (lVar3 = 0; lVar3 <= (long)pcVar4; lVar3 = lVar3 + 1) {
    TStack_38.fStore[lVar3] = (long)ppcVar1[lVar3] - (long)pcVar2 >> 3;
    pcVar4 = (complex<float> *)
             (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow;
  }
  TPZStream::Write<long>(buf,&TStack_38);
  TPZVec<long>::~TPZVec(&TStack_38);
  return;
}

Assistant:

void TPZSkylMatrix<TVar>::Write( TPZStream &buf, int withclassid ) const
{
    TPZMatrix<TVar>::Write(buf,withclassid);
    buf.Write( fStorage);
    TPZVec<int64_t> skyl(this->Rows()+1,0);
    TVar *ptr = 0;
    if (this->Rows()) {
        ptr = &fStorage[0];
    }
    for (int64_t i=0; i<this->Rows()+1; i++) {
        skyl[i] = fElem[i] - ptr;
    }
    buf.Write( skyl);
}